

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)9,QRgbaFloat<float>>
               (QRgbaFloat<float> *buf1,QRgbaFloat<float> *buf2,ushort *distxs,ushort *distys,
               int len,QTextureData *image,qreal *fx,qreal *fy,qreal *fw,qreal fdx,qreal fdy,
               qreal fdw)

{
  undefined8 *puVar1;
  uint uVar2;
  uchar *puVar3;
  double dVar4;
  double dVar5;
  double __x;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  double __x_00;
  
  if (0 < len) {
    lVar17 = 8;
    uVar16 = 0;
    do {
      uVar18 = -(ulong)(*fw == 0.0);
      dVar4 = (double)(uVar18 & 0x40d0000000000000 | ~uVar18 & (ulong)(1.0 / *fw));
      __x = *fx * dVar4 + -0.5;
      __x_00 = dVar4 * *fy + -0.5;
      dVar4 = floor(__x);
      dVar5 = floor(__x_00);
      distxs[uVar16] = (ushort)(int)((__x - (double)(int)dVar4) * 65536.0);
      distys[uVar16] = (ushort)(int)((__x_00 - (double)(int)dVar5) * 65536.0);
      uVar10 = image->width;
      iVar7 = (int)dVar4 % (int)uVar10;
      uVar8 = iVar7 >> 0x1f & uVar10;
      uVar14 = uVar8 + iVar7 + 1;
      uVar2 = image->height;
      if (uVar14 == uVar10) {
        uVar14 = 0;
      }
      iVar12 = (int)dVar5 % (int)uVar2;
      uVar9 = iVar12 >> 0x1f & uVar2;
      uVar10 = uVar9 + iVar12 + 1;
      if (uVar10 == uVar2) {
        uVar10 = 0;
      }
      lVar15 = (long)(int)(uVar9 + iVar12) * image->bytesPerLine;
      lVar11 = (long)(int)uVar10 * image->bytesPerLine;
      puVar3 = image->imageData;
      lVar13 = (long)(int)(uVar8 + iVar7) * 0x10;
      uVar6 = *(undefined8 *)(puVar3 + lVar13 + lVar15 + 8);
      puVar1 = (undefined8 *)((long)&buf1[-1].r + lVar17 * 2);
      *puVar1 = *(undefined8 *)(puVar3 + lVar13 + lVar15);
      puVar1[1] = uVar6;
      uVar6 = *(undefined8 *)(puVar3 + (long)(int)uVar14 * 0x10 + lVar15 + 8);
      puVar1 = (undefined8 *)((long)&buf1->r + lVar17 * 2);
      *puVar1 = *(undefined8 *)(puVar3 + (long)(int)uVar14 * 0x10 + lVar15);
      puVar1[1] = uVar6;
      uVar6 = *(undefined8 *)(puVar3 + lVar13 + lVar11 + 8);
      puVar1 = (undefined8 *)((long)&buf2[-1].r + lVar17 * 2);
      *puVar1 = *(undefined8 *)(puVar3 + lVar13 + lVar11);
      puVar1[1] = uVar6;
      uVar6 = *(undefined8 *)(puVar3 + (long)(int)uVar14 * 0x10 + lVar11 + 8);
      puVar1 = (undefined8 *)((long)&buf2->r + lVar17 * 2);
      *puVar1 = *(undefined8 *)(puVar3 + (long)(int)uVar14 * 0x10 + lVar11);
      puVar1[1] = uVar6;
      *fx = *fx + fdx;
      *fy = *fy + fdy;
      *fw = *fw + fdw;
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 0x10;
    } while ((uint)len != uVar16);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_slow_fetcher(T *buf1, T *buf2, ushort *distxs, ushort *distys,
                                                              const int len, const QTextureData &image,
                                                              qreal &fx, qreal &fy, qreal &fw,
                                                              const qreal fdx, const qreal fdy, const qreal fdw)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp);

    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;

    for (int i = 0; i < len; ++i) {
        const qreal iw = fw == 0 ? 16384 : 1 / fw;
        const qreal px = fx * iw - qreal(0.5);
        const qreal py = fy * iw - qreal(0.5);

        int x1 = qFloor(px);
        int x2;
        int y1 = qFloor(py);
        int y2;

        distxs[i] = ushort((px - x1) * (1<<16));
        distys[i] = ushort((py - y1) * (1<<16));

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);
        if constexpr (useFetch) {
            buf1[i * 2 + 0] = fetch1(s1, x1);
            buf1[i * 2 + 1] = fetch1(s1, x2);
            buf2[i * 2 + 0] = fetch1(s2, x1);
            buf2[i * 2 + 1] = fetch1(s2, x2);
        } else {
            buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
            buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
            buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
            buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
        }

        fx += fdx;
        fy += fdy;
        fw += fdw;
    }
}